

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::LeafPattern::~LeafPattern(LeafPattern *this)

{
  LeafPattern *this_local;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR_flat_0023bee8;
  value::~value(&this->fValue);
  std::__cxx11::string::~string((string *)&this->fName);
  Pattern::~Pattern(&this->super_Pattern);
  return;
}

Assistant:

LeafPattern(std::string name, value v = {})
		: fName(std::move(name)),
		  fValue(std::move(v))
		{}